

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

address_range_iterator __thiscall
llvm::DWARFVerifier::DieRangeInfo::insert(DieRangeInfo *this,DWARFAddressRange *R)

{
  bool bVar1;
  pointer pDVar2;
  __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  local_68;
  DWARFAddressRange *local_60;
  const_iterator local_58;
  __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  local_50;
  __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  Iter;
  __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  local_38;
  __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  Pos;
  iterator End;
  iterator Begin;
  DWARFAddressRange *R_local;
  DieRangeInfo *this_local;
  
  End = std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::begin
                  (&this->Ranges);
  Iter._M_current =
       (DWARFAddressRange *)
       std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::end
                 (&this->Ranges);
  Pos._M_current = Iter._M_current;
  local_38 = std::
             lower_bound<__gnu_cxx::__normal_iterator<llvm::DWARFAddressRange*,std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>,llvm::DWARFAddressRange>
                       (End._M_current,Iter,R);
  bVar1 = __gnu_cxx::operator!=(&local_38,&Pos);
  if (bVar1) {
    pDVar2 = __gnu_cxx::
             __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             ::operator->(&local_38);
    bVar1 = DWARFAddressRange::intersects(pDVar2,R);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<llvm::DWARFAddressRange_const*,std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
      ::__normal_iterator<llvm::DWARFAddressRange*>
                ((__normal_iterator<llvm::DWARFAddressRange_const*,std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                  *)&this_local,&local_38);
      return (address_range_iterator)(DWARFAddressRange *)this_local;
    }
    bVar1 = __gnu_cxx::operator!=(&local_38,&End);
    if (bVar1) {
      local_50 = __gnu_cxx::
                 __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                 ::operator-(&local_38,1);
      pDVar2 = __gnu_cxx::
               __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               ::operator->(&local_50);
      bVar1 = DWARFAddressRange::intersects(pDVar2,R);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<llvm::DWARFAddressRange_const*,std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
        ::__normal_iterator<llvm::DWARFAddressRange*>
                  ((__normal_iterator<llvm::DWARFAddressRange_const*,std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                    *)&this_local,&local_50);
        return (address_range_iterator)(DWARFAddressRange *)this_local;
      }
    }
  }
  __gnu_cxx::
  __normal_iterator<llvm::DWARFAddressRange_const*,std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
  ::__normal_iterator<llvm::DWARFAddressRange*>
            ((__normal_iterator<llvm::DWARFAddressRange_const*,std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
              *)&local_58,&local_38);
  local_60 = (DWARFAddressRange *)
             std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::insert
                       (&this->Ranges,local_58,R);
  local_68._M_current =
       (DWARFAddressRange *)
       std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::end
                 (&this->Ranges);
  __gnu_cxx::
  __normal_iterator<llvm::DWARFAddressRange_const*,std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
  ::__normal_iterator<llvm::DWARFAddressRange*>
            ((__normal_iterator<llvm::DWARFAddressRange_const*,std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
              *)&this_local,&local_68);
  return (address_range_iterator)(DWARFAddressRange *)this_local;
}

Assistant:

DWARFVerifier::DieRangeInfo::address_range_iterator
DWARFVerifier::DieRangeInfo::insert(const DWARFAddressRange &R) {
  auto Begin = Ranges.begin();
  auto End = Ranges.end();
  auto Pos = std::lower_bound(Begin, End, R);

  if (Pos != End) {
    if (Pos->intersects(R))
      return std::move(Pos);
    if (Pos != Begin) {
      auto Iter = Pos - 1;
      if (Iter->intersects(R))
        return std::move(Iter);
    }
  }

  Ranges.insert(Pos, R);
  return Ranges.end();
}